

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_libc.c
# Opt level: O2

err_t Write(filestream *p,void *Data,size_t Size,size_t *Written)

{
  size_t sVar1;
  err_t eVar2;
  size_t sVar3;
  
  if (-1 < (long)Size) {
    sVar1 = write(p->fd,Data,Size);
    eVar2 = 0;
    if (sVar1 != Size) {
      eVar2 = -0x16;
    }
    if ((long)sVar1 < 0) {
      eVar2 = -0x16;
    }
    if (Written != (size_t *)0x0) {
      sVar3 = 0;
      if (0 < (long)sVar1) {
        sVar3 = sVar1;
      }
      *Written = sVar3;
    }
    return eVar2;
  }
  return -0x16;
}

Assistant:

static err_t Write(filestream* p,const void* Data,size_t Size,size_t* Written)
{
    if (Size > SSIZE_MAX)
        return ERR_WRITE;
    err_t Err;
    ssize_t n = write(p->fd, Data, Size);

    if (n<0)
    {
        n=0;
        Err = ERR_WRITE;
    }
    else
        Err = (n != (ssize_t)Size) ? ERR_WRITE:ERR_NONE;

    if (Written)
        *Written = n;
    return Err;
}